

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

char * stb__reg_parse(stb_matcher *matcher,int start,char *regex,stb_uint16 *end)

{
  byte bVar1;
  byte bVar2;
  uint to;
  int iVar3;
  int iVar4;
  int iVar5;
  stb_uint32 *__s;
  long lVar6;
  byte bVar7;
  uint uVar8;
  byte *pbVar9;
  uint from;
  stb_uint16 last_end;
  int k [2];
  stb_uint8 flags [256];
  ushort local_14a;
  stb_uint16 *local_148;
  uint local_140 [2];
  byte local_138 [264];
  
  local_14a = (ushort)start;
  uVar8 = 0xffffffff;
  local_148 = end;
LAB_0015dbb7:
  to = (uint)local_14a;
  pbVar9 = (byte *)regex;
LAB_0015dbbd:
  regex = (char *)(pbVar9 + 1);
  bVar1 = *pbVar9;
  if (0x3e < bVar1) {
    if (bVar1 < 0x5b) {
      if (bVar1 == 0x3f) goto code_r0x0015dc08;
    }
    else if (bVar1 < 0x7b) {
      if (bVar1 == 0x5b) {
        if (matcher->num_charset == 0) {
          __s = (stb_uint32 *)malloc_base(matcher,0x400,STB__alloc,stb_alloc_alignment);
          matcher->charset = __s;
          memset(__s,0,0x400);
        }
        memset(local_138,0,0x100);
        bVar1 = *regex;
        pbVar9 = pbVar9 + 2;
        if (bVar1 != 0x5e) {
          pbVar9 = (byte *)regex;
        }
        bVar7 = *pbVar9;
        if (bVar7 != 0x5d) goto LAB_0015ddbf;
        local_138[0x5d] = 1;
        bVar7 = pbVar9[1];
        pbVar9 = pbVar9 + 1;
        goto joined_r0x0015ddb3;
      }
      if (bVar1 == 0x5c) {
        if (*regex == 0) {
          return (char *)0x0;
        }
        goto LAB_0015dc9a;
      }
    }
    else {
      if (bVar1 == 0x7b) {
        return (char *)0x0;
      }
      if (bVar1 == 0x7c) goto switchD_0015dbdd_caseD_29;
    }
    goto switchD_0015dbdd_caseD_25;
  }
  switch(bVar1) {
  case 0x24:
    iVar3 = stb__add_node(matcher);
    iVar4 = 10;
    break;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2c:
  case 0x2d:
    goto switchD_0015dbdd_caseD_25;
  case 0x28:
    uVar8 = (uint)local_14a;
    regex = stb__reg_parse_alt(matcher,uVar8,regex,&local_14a);
    if ((byte *)regex == (byte *)0x0) {
      return (char *)0x0;
    }
    if (*regex != 0x29) {
      return (char *)0x0;
    }
    goto LAB_0015dcef;
  case 0x29:
    goto switchD_0015dbdd_caseD_29;
  case 0x2a:
    if ((int)uVar8 < 0) {
      return (char *)0x0;
    }
    stb__add_epsilon(matcher,uVar8,to & 0xffff);
    goto LAB_0015dc2c;
  case 0x2b:
    if ((int)uVar8 < 0) {
      return (char *)0x0;
    }
LAB_0015dc2c:
    from = to & 0xffff;
    stb__add_epsilon(matcher,from,uVar8);
    to = stb__add_node(matcher);
    stb__add_epsilon(matcher,from,to);
    local_14a = (ushort)to;
    pbVar9 = (byte *)regex;
    goto LAB_0015dbbd;
  case 0x2e:
    iVar3 = stb__add_node(matcher);
    iVar4 = -1;
    break;
  default:
    if (bVar1 == 0) {
switchD_0015dbdd_caseD_29:
      *local_148 = local_14a;
      return (char *)pbVar9;
    }
    goto switchD_0015dbdd_caseD_25;
  }
  uVar8 = (uint)local_14a;
  stb__add_edge(matcher,uVar8,iVar3,iVar4);
  local_14a = (ushort)iVar3;
  goto LAB_0015dbb7;
joined_r0x0015ddb3:
  if (bVar7 == 0x5d) goto LAB_0015de0c;
LAB_0015ddbf:
  if (bVar7 == 0) {
    return (char *)0x0;
  }
  uVar8 = (uint)(char)bVar7;
  if (pbVar9[1] == 0x2d) {
    bVar2 = pbVar9[2];
    if ((int)(char)bVar2 == 0x5d) goto LAB_0015dddd;
    if (bVar2 < bVar7) {
      return (char *)0x0;
    }
    pbVar9 = pbVar9 + 3;
    do {
      local_138[uVar8] = 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 <= (uint)(int)(char)bVar2);
  }
  else {
LAB_0015dddd:
    pbVar9 = pbVar9 + 1;
    local_138[uVar8] = 1;
  }
  bVar7 = *pbVar9;
  goto joined_r0x0015ddb3;
LAB_0015de0c:
  if (bVar1 == 0x5e) {
    lVar6 = 0;
    do {
      local_138[lVar6] = 1 - local_138[lVar6];
      local_138[lVar6 + 1] = 1 - local_138[lVar6 + 1];
      local_138[lVar6 + 2] = 1 - local_138[lVar6 + 2];
      local_138[lVar6 + 3] = 1 - local_138[lVar6 + 3];
      local_138[lVar6 + 4] = 1 - local_138[lVar6 + 4];
      local_138[lVar6 + 5] = 1 - local_138[lVar6 + 5];
      local_138[lVar6 + 6] = 1 - local_138[lVar6 + 6];
      local_138[lVar6 + 7] = 1 - local_138[lVar6 + 7];
      local_138[lVar6 + 8] = 1 - local_138[lVar6 + 8];
      local_138[lVar6 + 9] = 1 - local_138[lVar6 + 9];
      local_138[lVar6 + 10] = 1 - local_138[lVar6 + 10];
      local_138[lVar6 + 0xb] = 1 - local_138[lVar6 + 0xb];
      local_138[lVar6 + 0xc] = 1 - local_138[lVar6 + 0xc];
      local_138[lVar6 + 0xd] = 1 - local_138[lVar6 + 0xd];
      local_138[lVar6 + 0xe] = 1 - local_138[lVar6 + 0xe];
      local_138[lVar6 + 0xf] = 1 - local_138[lVar6 + 0xf];
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x100);
  }
  iVar3 = matcher->num_charset;
  if (iVar3 < 1) {
    iVar4 = 0;
LAB_0015de81:
    iVar5 = iVar4;
    if (iVar4 != iVar3) goto LAB_0015deba;
  }
  else {
    iVar4 = 0;
    do {
      local_140[1] = 1 << ((byte)iVar4 & 0x1f);
      local_140[0] = 0;
      lVar6 = 0;
      while ((matcher->charset[lVar6] & local_140[1]) == local_140[local_138[lVar6]]) {
        lVar6 = lVar6 + 1;
        if (lVar6 == 0x100) goto LAB_0015de81;
      }
      iVar4 = iVar4 + 1;
      iVar5 = iVar3;
    } while (iVar4 != iVar3);
  }
  matcher->num_charset = iVar3 + 1;
  if (0x1f < iVar3) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x2429,"char *stb__reg_parse(stb_matcher *, int, char *, stb_uint16 *)");
  }
  lVar6 = 0;
  do {
    if (local_138[lVar6] != 0) {
      matcher->charset[lVar6] = matcher->charset[lVar6] | 1 << ((byte)iVar3 & 0x1f);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
LAB_0015deba:
  regex = (char *)(pbVar9 + 1);
  iVar3 = stb__add_node(matcher);
  uVar8 = (uint)local_14a;
  stb__add_edge(matcher,uVar8,iVar3,-2 - iVar5);
  local_14a = (ushort)iVar3;
  goto LAB_0015dbb7;
code_r0x0015dc08:
  if ((int)uVar8 < 0) {
    return (char *)0x0;
  }
  stb__add_epsilon(matcher,uVar8,to & 0xffff);
  pbVar9 = (byte *)regex;
  goto LAB_0015dbbd;
switchD_0015dbdd_caseD_25:
  regex = (char *)pbVar9;
LAB_0015dc9a:
  iVar3 = stb__add_node(matcher);
  uVar8 = (uint)local_14a;
  stb__add_edge(matcher,uVar8,iVar3,(int)*regex);
  local_14a = (ushort)iVar3;
LAB_0015dcef:
  regex = (char *)((byte *)regex + 1);
  goto LAB_0015dbb7;
}

Assistant:

static char *stb__reg_parse(stb_matcher *matcher, int start, char *regex, stb_uint16 *end)
{
   int n;
   int last_start = -1;
   stb_uint16 last_end = start;

   while (*regex) {
      switch (*regex) {
         case '(':
            last_start = last_end;
            regex = stb__reg_parse_alt(matcher, last_end, regex+1, &last_end);
            if (regex == NULL || *regex != ')')
               return NULL;
            ++regex;
            break;

         case '|':
         case ')':
            *end = last_end;
            return regex;

         case '?':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_start, last_end);
            ++regex;
            break;

         case '*':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_start, last_end);

            // fall through

         case '+':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_end, last_start);
            // prevent links back to last_end from chaining to last_start
            n = stb__add_node(matcher);
            stb__add_epsilon(matcher, last_end, n);
            last_end = n;
            ++regex;
            break;

         case '{':   // not supported!
            // @TODO: given {n,m}, clone last_start to last_end m times,
            // and include epsilons from start to first m-n blocks
            return NULL; 

         case '\\':
            ++regex;
            if (!*regex) return NULL;

            // fallthrough
         default: // match exactly this character
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, *regex);
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '$':
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, '\n');
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '.':
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, -1);
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '[': {
            stb_uint8 flags[256];
            int invert = 0,z;
            ++regex;
            if (matcher->num_charset == 0) {
               matcher->charset = (stb_uint *) stb_malloc(matcher, sizeof(*matcher->charset) * 256);
               memset(matcher->charset, 0, sizeof(*matcher->charset) * 256);
            }

            memset(flags,0,sizeof(flags));

            // leading ^ is special
            if (*regex == '^')
               ++regex, invert = 1;

            // leading ] is special
            if (*regex == ']') {
               flags[']'] = 1;
               ++regex;
            }
            while (*regex != ']') {
               stb_uint a;
               if (!*regex) return NULL;
               a = *regex++;
               if (regex[0] == '-' && regex[1] != ']') {
                  stb_uint i,b = regex[1];
                  regex += 2;
                  if (b == 0) return NULL;
                  if (a > b) return NULL;
                  for (i=a; i <= b; ++i)
                     flags[i] = 1;
               } else
                  flags[a] = 1;
            }
            ++regex;
            if (invert) {
               int i;
               for (i=0; i < 256; ++i)
                  flags[i] = 1-flags[i];
            }

            // now check if any existing charset matches
            for (z=0; z < matcher->num_charset; ++z) {
               int i, k[2] = { 0, 1 << z};
               for (i=0; i < 256; ++i) {
                  unsigned int f = k[flags[i]];
                  if ((matcher->charset[i] & k[1]) != f)
                     break;
               }
               if (i == 256) break;
            }

            if (z == matcher->num_charset) {
               int i;
               ++matcher->num_charset;
               if (matcher->num_charset > 32) {
                  assert(0); /* NOTREACHED */
                  return NULL; // too many charsets, oops
               }
               for (i=0; i < 256; ++i)
                  if (flags[i])
                     matcher->charset[i] |= (1 << z);
            }

            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, -2 - z);
            last_start = last_end;
            last_end = n;
            break;
         }
      }
   }
   *end = last_end;
   return regex;
}